

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O1

void opj_sparse_array_int32_free(opj_sparse_array_int32_t *sa)

{
  ulong uVar1;
  
  if (sa != (opj_sparse_array_int32_t *)0x0) {
    if (sa->block_count_ver * sa->block_count_hor != 0) {
      uVar1 = 0;
      do {
        if (sa->data_blocks[uVar1] != (OPJ_INT32 *)0x0) {
          opj_free(sa->data_blocks[uVar1]);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < sa->block_count_ver * sa->block_count_hor);
    }
    opj_free(sa->data_blocks);
    opj_free(sa);
    return;
  }
  return;
}

Assistant:

void opj_sparse_array_int32_free(opj_sparse_array_int32_t* sa)
{
    if (sa) {
        OPJ_UINT32 i;
        for (i = 0; i < sa->block_count_hor * sa->block_count_ver; i++) {
            if (sa->data_blocks[i]) {
                opj_free(sa->data_blocks[i]);
            }
        }
        opj_free(sa->data_blocks);
        opj_free(sa);
    }
}